

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfi.cpp
# Opt level: O1

void __thiscall DFIDisk::~DFIDisk(DFIDisk *this)

{
  std::
  _Rb_tree<CylHead,_std::pair<const_CylHead,_Data>,_std::_Select1st<std::pair<const_CylHead,_Data>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>
  ::~_Rb_tree(&(this->m_data)._M_t);
  Disk::~Disk((Disk *)this);
  operator_delete(this,0x148);
  return;
}

Assistant:

void add_track_data(const CylHead& cylhead, Data&& data)
    {
        // Determine image clock rate if not yet known. It seems reasonable
        // to assume this will not vary between tracks.
        if (!m_tick_ns)
        {
            uint32_t index_pos = 0;
            for (auto byte : data)
            {
                index_pos += (byte & 0x7f);
                if (byte & 0x80)
                    break;
            }

            // Oddly, the clock frequency isn't stored in the image, so guess it.
            for (auto mhz = 25; !m_tick_ns && mhz <= 100; mhz *= 2)
            {
                auto rpm = 60'000'000ULL * mhz / index_pos;
                if (rpm >= 285 && rpm <= 380)
                    m_tick_ns = 1000 / mhz;
            }

            // Fail if we couldn't determine the clock rate
            if (!m_tick_ns)
                throw util::exception("failed to determine DFI clock frequency");
        }

        m_data[cylhead] = std::move(data);
        extend(cylhead);
    }